

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

uint32_t defaultGetFoldedValue(UNewTrie *trie,UChar32 start,int32_t offset)

{
  char local_2d;
  int local_2c;
  uint32_t uStack_28;
  UBool inBlockZero;
  UChar32 limit;
  uint32_t initialValue;
  uint32_t value;
  int32_t offset_local;
  UChar32 start_local;
  UNewTrie *trie_local;
  
  uStack_28 = *trie->data;
  local_2c = start + 0x400;
  initialValue = offset;
  value = start;
  _offset_local = trie;
  while( true ) {
    while( true ) {
      if (local_2c <= (int)value) {
        return 0;
      }
      limit = utrie_get32_63(_offset_local,value,&local_2d);
      if (local_2d == '\0') break;
      value = value + 0x20;
    }
    if (limit != uStack_28) break;
    value = value + 1;
  }
  return initialValue;
}

Assistant:

static uint32_t U_CALLCONV
defaultGetFoldedValue(UNewTrie *trie, UChar32 start, int32_t offset) {
    uint32_t value, initialValue;
    UChar32 limit;
    UBool inBlockZero;

    initialValue=trie->data[0];
    limit=start+0x400;
    while(start<limit) {
        value=utrie_get32(trie, start, &inBlockZero);
        if(inBlockZero) {
            start+=UTRIE_DATA_BLOCK_LENGTH;
        } else if(value!=initialValue) {
            return (uint32_t)offset;
        } else {
            ++start;
        }
    }
    return 0;
}